

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O0

void spki_table_free_without_notify(spki_table *spki_table)

{
  long lVar1;
  long in_FS_OFFSET;
  spki_table *spki_table_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pthread_rwlock_wrlock((pthread_rwlock_t *)&spki_table->lock);
  spki_table->update_fp = (spki_update_fp)0x0;
  tommy_list_foreach(&spki_table->list,free);
  tommy_hashlin_done(&spki_table->hashtable);
  pthread_rwlock_unlock((pthread_rwlock_t *)&spki_table->lock);
  pthread_rwlock_destroy((pthread_rwlock_t *)&spki_table->lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void spki_table_free_without_notify(struct spki_table *spki_table)
{
	pthread_rwlock_wrlock(&spki_table->lock);

	spki_table->update_fp = NULL;
	tommy_list_foreach(&spki_table->list, free);
	tommy_hashlin_done(&spki_table->hashtable);

	pthread_rwlock_unlock(&spki_table->lock);
	pthread_rwlock_destroy(&spki_table->lock);
}